

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void __thiscall
Js::JavascriptArray::BigIndex::SetItemIfNotExist(BigIndex *this,JavascriptArray *arr,Var newValue)

{
  uint32 index;
  uint uVar1;
  ScriptContext *scriptContext;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined1 local_38 [8];
  Var oldValue;
  PropertyRecord *propertyRecord;
  
  index = this->index;
  if (index == 0xffffffff) {
    scriptContext =
         (((((arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
           javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    JavascriptOperators::GetPropertyIdForInt
              (this->bigIndex,scriptContext,(PropertyRecord **)&oldValue);
    uVar1 = *(uint *)((long)oldValue + 8);
    iVar5 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x12])(arr,arr,(ulong)uVar1,local_38,0,scriptContext);
    if (iVar5 != 1) {
      (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x17])
                (arr,(ulong)uVar1,newValue,0,0);
    }
  }
  else {
    if ((arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
        (_func_int **)VirtualTableInfo<Js::JavascriptArray>::Address) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                  ,0x655,
                                  "(VirtualTableInfo<JavascriptArray>::HasVirtualTable(this))",
                                  "VirtualTableInfo<JavascriptArray>::HasVirtualTable(this)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    BVar4 = DirectGetItemAt<void*>(arr,index,&oldValue);
    if (BVar4 == 0) {
      DirectSetItemAt<void*>(arr,index,newValue);
    }
  }
  return;
}

Assistant:

void JavascriptArray::BigIndex::SetItemIfNotExist(JavascriptArray* arr, Var newValue) const
    {
        if (IsSmallIndex())
        {
            small_index::SetItemIfNotExist(arr, index, newValue);
        }
        else
        {
            ScriptContext* scriptContext = arr->GetScriptContext();
            PropertyRecord const * propertyRecord;
            JavascriptOperators::GetPropertyIdForInt(bigIndex, scriptContext, &propertyRecord);
            Var oldValue;
            PropertyId propertyId = propertyRecord->GetPropertyId();
            if (!arr->GetProperty(arr, propertyId, &oldValue, NULL, scriptContext))
            {
                arr->SetProperty(propertyId, newValue, PropertyOperation_None, NULL);
            }
        }
    }